

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall QTreeWidgetItem::insertChild(QTreeWidgetItem *this,int index,QTreeWidgetItem *child)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  QTreeModel *this_00;
  QTreeWidgetItem *pQVar4;
  value_type pQVar5;
  int c;
  ulong uVar6;
  QTreeWidgetItemPrivate *this_01;
  ulong i;
  long lVar7;
  long in_FS_OFFSET;
  QList<QTreeWidgetItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((-1 < index) && (child != (QTreeWidgetItem *)0x0)) &&
      (i = (ulong)(uint)index, i <= (ulong)(this->children).d.size)) &&
     ((child->view == (QTreeWidget *)0x0 && (child->par == (QTreeWidgetItem *)0x0)))) {
    this_01 = (QTreeWidgetItemPrivate *)&this->children;
    this_00 = treeModel(this,(QTreeWidget *)0x0);
    if (this_00 == (QTreeModel *)0x0) {
      child->par = this;
      QList<QTreeWidgetItem_*>::insert((QList<QTreeWidgetItem_*> *)this_01,i,child);
    }
    else {
      bVar1 = this_00->skipPendingSort;
      this_00->skipPendingSort = true;
      pQVar4 = (QTreeWidgetItem *)0x0;
      if (this_00->rootItem != this) {
        pQVar4 = this;
      }
      child->par = pQVar4;
      bVar2 = QTreeView::isSortingEnabled(&this->view->super_QTreeView);
      if ((bVar2) && ((this_00->sortPendingTimer).m_id == Invalid)) {
        QBasicTimer::start(&this_00->sortPendingTimer,(Duration)0x0,(QObject *)this_00);
      }
      QTreeModel::beginInsertItems(this_00,this,index,1);
      local_58.d.d = (Data *)0xffffffffffffffff;
      local_58.d.ptr = (QTreeWidgetItem **)0x0;
      local_58.d.size = 0;
      iVar3 = (**(code **)(*(long *)this_00 + 0x80))(this_00,&local_58);
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (QTreeWidgetItem **)0x0;
      local_58.d.size = 0;
      QList<QTreeWidgetItem_*>::append(&local_58,child);
      while ((QVariant *)local_58.d.size != (QVariant *)0x0) {
        pQVar5 = QList<QTreeWidgetItem_*>::takeLast(&local_58);
        pQVar5->view = this->view;
        QList<QList<QWidgetItemData>_>::reserve(&pQVar5->values,(long)iVar3);
        lVar7 = 0;
        for (uVar6 = 0; uVar6 < (ulong)(pQVar5->children).d.size; uVar6 = uVar6 + 1) {
          QStack<QTreeWidgetItem_*>::push
                    ((QStack<QTreeWidgetItem_*> *)&local_58,
                     (QTreeWidgetItem **)((long)(pQVar5->children).d.ptr + lVar7));
          lVar7 = lVar7 + 8;
        }
      }
      QList<QTreeWidgetItem_*>::insert((QList<QTreeWidgetItem_*> *)this_01,i,child);
      QTreeWidgetItemPrivate::updateHiddenStatus(this_01,child,true);
      QAbstractItemModel::endInsertRows();
      this_01 = (QTreeWidgetItemPrivate *)&local_58;
      QArrayDataPointer<QTreeWidgetItem_*>::~QArrayDataPointer
                ((QArrayDataPointer<QTreeWidgetItem_*> *)this_01);
      this_00->skipPendingSort = bVar1;
    }
    if (child->par != (QTreeWidgetItem *)0x0) {
      QTreeWidgetItemPrivate::propagateDisabled(this_01,child);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetItem::insertChild(int index, QTreeWidgetItem *child)
{
    if (index < 0 || index > children.size() || child == nullptr || child->view != nullptr || child->par != nullptr)
        return;

    if (QTreeModel *model = treeModel()) {
        QTreeModel::SkipSorting skipSorting(model);
        if (model->rootItem == this)
            child->par = nullptr;
        else
            child->par = this;
        if (view->isSortingEnabled()) {
            // do a delayed sort instead
            if (!model->sortPendingTimer.isActive())
                model->sortPendingTimer.start(0, model);
        }
        model->beginInsertItems(this, index, 1);
        int cols = model->columnCount();
        QStack<QTreeWidgetItem*> stack;
        stack.push(child);
        while (!stack.isEmpty()) {
            QTreeWidgetItem *i = stack.pop();
            i->view = view;
            i->values.reserve(cols);
            for (int c = 0; c < i->children.size(); ++c)
                stack.push(i->children.at(c));
        }
        children.insert(index, child);
        d->updateHiddenStatus(child, true);
        model->endInsertItems();
    } else {
        child->par = this;
        children.insert(index, child);
    }
    if (child->par)
        d->propagateDisabled(child);
}